

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Data::Reader> expected)

{
  Exception *__s1;
  size_t __n;
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  bool bVar5;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  Fault f;
  ArrayPtr<unsigned_char> local_68;
  ulong local_58;
  byte *local_50;
  CapTableBuilder *local_48;
  SegmentBuilder *local_40;
  ListElementCount local_34;
  
  puVar3 = (uchar *)expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (uchar *)(ulong)reader.builder.elementCount == puVar3;
  if (_kjCondition.result) {
    if (puVar3 != (uchar *)0x0) {
      local_40 = reader.builder.segment;
      local_48 = reader.builder.capTable;
      local_50 = reader.builder.ptr;
      local_58 = (ulong)reader.builder.step;
      puVar2 = (uchar *)0x0;
      puVar4 = (uchar *)0x1;
      do {
        __s1 = (Exception *)expected._M_array[(long)puVar2].super_ArrayPtr<const_unsigned_char>.ptr;
        __n = expected._M_array[(long)puVar2].super_ArrayPtr<const_unsigned_char>.size_;
        _kjCondition.op.content.ptr = (char *)(local_50 + ((long)puVar2 * local_58 >> 3));
        _kjCondition.left = (unsigned_long)local_40;
        _kjCondition._8_8_ = local_48;
        bVar5 = false;
        local_68 = (ArrayPtr<unsigned_char>)
                   PointerBuilder::getBlob<capnp::Data>
                             ((PointerBuilder *)&_kjCondition,(void *)0x0,0);
        f.exception = __s1;
        if (__n == local_68.size_) {
          if (__n == 0) {
            bVar5 = true;
          }
          else {
            iVar1 = bcmp(__s1,local_68.ptr,__n);
            bVar5 = iVar1 == 0;
          }
        }
        _kjCondition.left = (unsigned_long)&f;
        _kjCondition._8_8_ = &local_68;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = bVar5;
        if ((bVar5 == false) && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::
          log<char_const(&)[28],kj::_::DebugComparison<capnp::Data::Reader&,capnp::Data::Reader&>&,capnp::Data::Reader&,capnp::Data::Reader&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                     (char (*) [28])"failed: expected (a) == (b)",
                     (DebugComparison<capnp::Data::Reader_&,_capnp::Data::Reader_&> *)&_kjCondition,
                     (Reader *)&f,(Reader *)&local_68);
        }
        bVar5 = puVar4 < puVar3;
        puVar2 = puVar4;
        puVar4 = (uchar *)(ulong)((int)puVar4 + 1);
      } while (bVar5);
    }
    return;
  }
  local_68.ptr = puVar3;
  local_34 = reader.builder.elementCount;
  _kjCondition.left = (unsigned_long)puVar3;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,(unsigned_long *)&local_68,
             &local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}